

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O2

void GetProjectCommandsInScriptMode(cmState *state)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_compile_options",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_custom_command",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_custom_target",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_definitions",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_dependencies",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_executable",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_library",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"add_subdirectory",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"add_test",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"aux_source_directory",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"build_command",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"create_test_sourcelist",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"define_property",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"enable_language",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"enable_testing",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"export",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"fltk_wrap_ui",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_source_file_property",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_target_property",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"get_test_property",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_directories",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_external_msproject",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"include_regular_expression",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"install",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"link_directories",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"link_libraries",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"load_cache",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"project",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"qt_wrap_cpp",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"qt_wrap_ui",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"remove_definitions",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_source_files_properties",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_target_properties",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"set_tests_properties",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"source_group",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_definitions",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_features",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_compile_options",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_include_directories",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"target_link_libraries",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"target_sources",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"try_compile",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"try_run",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"export_library_dependencies",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"load_command",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"output_required_files",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"subdir_depends",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"utility_source",&local_29)
  ;
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"variable_requires",&local_29);
  cmState::AddUnexpectedCommand(state,&local_28,"command is not scriptable");
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void GetProjectCommandsInScriptMode(cmState* state)
{
#define CM_UNEXPECTED_PROJECT_COMMAND(NAME)                                   \
  state->AddUnexpectedCommand(NAME, "command is not scriptable")

  CM_UNEXPECTED_PROJECT_COMMAND("add_compile_options");
  CM_UNEXPECTED_PROJECT_COMMAND("add_custom_command");
  CM_UNEXPECTED_PROJECT_COMMAND("add_custom_target");
  CM_UNEXPECTED_PROJECT_COMMAND("add_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("add_dependencies");
  CM_UNEXPECTED_PROJECT_COMMAND("add_executable");
  CM_UNEXPECTED_PROJECT_COMMAND("add_library");
  CM_UNEXPECTED_PROJECT_COMMAND("add_subdirectory");
  CM_UNEXPECTED_PROJECT_COMMAND("add_test");
  CM_UNEXPECTED_PROJECT_COMMAND("aux_source_directory");
  CM_UNEXPECTED_PROJECT_COMMAND("build_command");
  CM_UNEXPECTED_PROJECT_COMMAND("create_test_sourcelist");
  CM_UNEXPECTED_PROJECT_COMMAND("define_property");
  CM_UNEXPECTED_PROJECT_COMMAND("enable_language");
  CM_UNEXPECTED_PROJECT_COMMAND("enable_testing");
  CM_UNEXPECTED_PROJECT_COMMAND("export");
  CM_UNEXPECTED_PROJECT_COMMAND("fltk_wrap_ui");
  CM_UNEXPECTED_PROJECT_COMMAND("get_source_file_property");
  CM_UNEXPECTED_PROJECT_COMMAND("get_target_property");
  CM_UNEXPECTED_PROJECT_COMMAND("get_test_property");
  CM_UNEXPECTED_PROJECT_COMMAND("include_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("include_external_msproject");
  CM_UNEXPECTED_PROJECT_COMMAND("include_regular_expression");
  CM_UNEXPECTED_PROJECT_COMMAND("install");
  CM_UNEXPECTED_PROJECT_COMMAND("link_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("link_libraries");
  CM_UNEXPECTED_PROJECT_COMMAND("load_cache");
  CM_UNEXPECTED_PROJECT_COMMAND("project");
  CM_UNEXPECTED_PROJECT_COMMAND("qt_wrap_cpp");
  CM_UNEXPECTED_PROJECT_COMMAND("qt_wrap_ui");
  CM_UNEXPECTED_PROJECT_COMMAND("remove_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("set_source_files_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("set_target_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("set_tests_properties");
  CM_UNEXPECTED_PROJECT_COMMAND("source_group");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_definitions");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_features");
  CM_UNEXPECTED_PROJECT_COMMAND("target_compile_options");
  CM_UNEXPECTED_PROJECT_COMMAND("target_include_directories");
  CM_UNEXPECTED_PROJECT_COMMAND("target_link_libraries");
  CM_UNEXPECTED_PROJECT_COMMAND("target_sources");
  CM_UNEXPECTED_PROJECT_COMMAND("try_compile");
  CM_UNEXPECTED_PROJECT_COMMAND("try_run");

  // deprecated commands
  CM_UNEXPECTED_PROJECT_COMMAND("export_library_dependencies");
  CM_UNEXPECTED_PROJECT_COMMAND("load_command");
  CM_UNEXPECTED_PROJECT_COMMAND("output_required_files");
  CM_UNEXPECTED_PROJECT_COMMAND("subdir_depends");
  CM_UNEXPECTED_PROJECT_COMMAND("utility_source");
  CM_UNEXPECTED_PROJECT_COMMAND("variable_requires");

#undef CM_UNEXPECTED_PROJECT_COMMAND
}